

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

SpectrumHandle __thiscall
pbrt::ParameterDictionary::GetOneSpectrum
          (ParameterDictionary *this,string *name,SpectrumHandle *defaultValue,
          SpectrumType spectrumType,Allocator alloc)

{
  long lVar1;
  ParsedParameter *param;
  bool bVar2;
  undefined4 in_register_0000000c;
  Allocator in_R9;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> s;
  _Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> local_48;
  
  lVar1 = *(long *)((long)&name[2].field_2 + 8);
  paVar4 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name->_M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)name->_M_string_length;
  }
  lVar3 = 0;
  do {
    if (lVar1 << 3 == lVar3) {
      (this->params).alloc.memoryResource =
           *(memory_resource **)CONCAT44(in_register_0000000c,spectrumType);
      return (SpectrumHandle)
             (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
              )this;
    }
    param = *(ParsedParameter **)((long)paVar4 + lVar3);
    bVar2 = std::operator!=(&param->name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            defaultValue);
    if (!bVar2) {
      extractSpectrumArray
                ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)&local_48,
                 (ParameterDictionary *)name,param,(SpectrumType)alloc.memoryResource,in_R9);
      if (local_48._M_impl.super__Vector_impl_data._M_start !=
          local_48._M_impl.super__Vector_impl_data._M_finish) {
        if ((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48._M_impl.super__Vector_impl_data._M_start) < 9) {
          (this->params).alloc.memoryResource =
               (memory_resource *)
               ((local_48._M_impl.super__Vector_impl_data._M_start)->
               super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               ).bits;
          std::_Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::
          ~_Vector_base(&local_48);
          return (SpectrumHandle)
                 (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                  )this;
        }
        ErrorExit<std::__cxx11::string_const&>
                  (&param->loc,"More than one value provided for parameter \"%s\".",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)defaultValue
                  );
      }
      std::_Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::~_Vector_base
                (&local_48);
    }
    lVar3 = lVar3 + 8;
  } while( true );
}

Assistant:

SpectrumHandle ParameterDictionary::GetOneSpectrum(const std::string &name,
                                                   SpectrumHandle defaultValue,
                                                   SpectrumType spectrumType,
                                                   Allocator alloc) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name)
            continue;

        std::vector<SpectrumHandle> s = extractSpectrumArray(*p, spectrumType, alloc);
        if (!s.empty()) {
            if (s.size() > 1)
                ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                          name);
            return s[0];
        }
    }

    return defaultValue;
}